

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceManager::selectedLongRangeInteractions
          (ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  Vector3d *pVVar1;
  Vector3d *pos;
  bool *pbVar2;
  double dVar3;
  CutoffMethod CVar4;
  uint uVar5;
  uint uVar6;
  SimInfo *pSVar7;
  Snapshot *pSVar8;
  CutoffGroup *pCVar9;
  ForceDecomposition *pFVar10;
  pointer pdVar11;
  double dVar12;
  bool bVar13;
  bool bVar14;
  uint i;
  uint uVar15;
  int iVar16;
  int iVar17;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  undefined4 extraout_var_01;
  double *pdVar18;
  ulong uVar19;
  undefined4 extraout_var_03;
  double (*padVar20) [3];
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  double (*padVar21) [3];
  pointer piVar22;
  uint i_3;
  Mat3x3d *pMVar23;
  long lVar24;
  SelfData *pSVar25;
  ulong uVar26;
  uint *puVar27;
  long lVar28;
  pointer ppCVar29;
  char cVar30;
  ulong uVar31;
  double tmp;
  Mat3x3d bbox;
  vector<int,_std::allocator<int>_> atomListRow;
  vector<int,_std::allocator<int>_> atomListColumn;
  Vector3d fg;
  Vector3d vel2;
  Vector3d dag;
  Vector3d d_grp;
  RealType surfacePotential;
  RealType reciprocalPotential;
  RealType rgrpsq;
  Vector3d fij;
  Vector3d gvel2;
  RealType dswdr;
  RealType rgrp;
  Vector<double,_7U> result_10;
  Mat3x3d local_518;
  double local_4c8;
  ulong uStack_4c0;
  vector<int,_std::allocator<int>_> local_4b8;
  vector<int,_std::allocator<int>_> local_498;
  long local_478;
  InteractionData *local_470;
  double local_468 [3];
  uint *local_450;
  Mat3x3d *local_448;
  double local_440;
  vector<int,_std::allocator<int>_> *local_438;
  uint local_42c;
  double local_428 [4];
  double local_408 [4];
  double local_3e8 [3];
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_3d0;
  SelfData *local_3c8;
  long local_3c0;
  Snapshot *local_3b8;
  RealType local_3b0;
  RealType local_3a8;
  double local_3a0 [5];
  double local_378 [8];
  double local_338;
  double dStack_330;
  double local_328;
  vector<int,_std::allocator<int>_> *local_318;
  RealType *local_310;
  Vector3d *local_308;
  RealType *local_300;
  long local_2f8;
  RealType *local_2f0;
  potVec *local_2e8;
  potVec *local_2e0;
  potVec *local_2d8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2d0;
  double local_2b8;
  double local_2b0;
  double local_2a8 [8];
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  double local_1d8;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  double local_1b8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  double local_198;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  double local_178;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  double local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  double local_138;
  potVec local_128;
  potVec local_e8;
  potVec local_a8;
  potVec local_68;
  undefined4 extraout_var_02;
  
  pSVar7 = this->info_;
  pSVar8 = pSVar7->sman_->currentSnapshot_;
  local_3b8 = pSVar8;
  if (pSVar7->nCutoffGroups_ == pSVar7->nAtoms_) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (&(pSVar8->cgData).position,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)pSVar8)
    ;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (&(pSVar8->cgData).velocity,&(pSVar8->atomData).velocity);
  }
  else {
    ppCVar29 = (mol1->cutoffGroups_).
               super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar29 !=
        (mol1->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pCVar9 = *ppCVar29;
      while (pCVar9 != (CutoffGroup *)0x0) {
        ppCVar29 = ppCVar29 + 1;
        CutoffGroup::updateCOM(pCVar9);
        if (ppCVar29 ==
            (mol1->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pCVar9 = *ppCVar29;
      }
    }
    ppCVar29 = (mol2->cutoffGroups_).
               super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar29 !=
        (mol2->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pCVar9 = *ppCVar29;
      while (pCVar9 != (CutoffGroup *)0x0) {
        ppCVar29 = ppCVar29 + 1;
        CutoffGroup::updateCOM(pCVar9);
        if (ppCVar29 ==
            (mol2->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pCVar9 = *ppCVar29;
      }
    }
  }
  (*this->fDecomp_->_vptr_ForceDecomposition[5])();
  (*this->fDecomp_->_vptr_ForceDecomposition[4])();
  local_3e8[2] = 0.0;
  local_3e8[0] = 0.0;
  local_3e8[1] = 0.0;
  local_408[2] = 0.0;
  local_408[0] = 0.0;
  local_408[1] = 0.0;
  local_328 = 0.0;
  local_338 = 0.0;
  dStack_330 = 0.0;
  local_428[2] = 0.0;
  local_428[0] = 0.0;
  local_428[1] = 0.0;
  local_3a0[3] = 0.0;
  local_3a0[1] = 0.0;
  local_3a0[2] = 0.0;
  local_468[2] = 0.0;
  local_468[0] = 0.0;
  local_468[1] = 0.0;
  local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1f8 = 0.0;
  local_208 = 0.0;
  dStack_200 = 0.0;
  local_218 = 0.0;
  dStack_210 = 0.0;
  local_228 = 0.0;
  dStack_220 = 0.0;
  local_238 = 0.0;
  local_248 = 0.0;
  dStack_240 = 0.0;
  local_258 = 0.0;
  dStack_250 = 0.0;
  local_268 = 0.0;
  dStack_260 = 0.0;
  local_378[6] = 0.0;
  local_378[4] = 0.0;
  local_378[5] = 0.0;
  local_378[2] = 0.0;
  local_378[3] = 0.0;
  local_378[0] = 0.0;
  local_378[1] = 0.0;
  local_3a8 = 0.0;
  local_3b0 = 0.0;
  (this->idat).rcut = this->rCut_;
  CVar4 = this->cutoffMethod_;
  (this->idat).shiftedPot = CVar4 == SHIFTED_POTENTIAL;
  (this->idat).shiftedForce = CVar4 - SHIFTED_FORCE < 2;
  local_470 = &this->idat;
  bVar14 = this->doParticlePot_;
  (this->idat).doParticlePot = bVar14;
  bVar13 = this->doSitePotential_;
  (this->idat).doElectricField = this->doElectricField_;
  (this->idat).doSitePotential = bVar13;
  pSVar25 = &this->sdat;
  (this->sdat).doParticlePot = bVar14;
  uVar15 = this->info_->requiresPrepair_ ^ 1;
  local_3d0 = &this->savedPositions_;
  local_318 = &this->neighborList_;
  local_438 = &this->point_;
  local_308 = &(this->idat).eField1;
  local_310 = &(this->idat).sPot1;
  local_300 = &(this->idat).sw;
  local_2d8 = &(this->idat).pot;
  local_2e0 = &(this->idat).excludedPot;
  local_2e8 = &(this->idat).selePot;
  local_440 = 0.0;
  pVVar1 = &(this->idat).f1;
  local_2f0 = &(this->idat).dVdFQ1;
  pos = &(this->idat).d;
  local_448 = &this->virialTensor;
  local_42c = uVar15;
  local_3c8 = pSVar25;
  while( true ) {
    if (uVar15 == local_42c) {
      pFVar10 = this->fDecomp_;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                (&local_2d0,local_3d0);
      iVar16 = (*pFVar10->_vptr_ForceDecomposition[0x10])(pFVar10);
      if (local_2d0.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d0.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((char)iVar16 != '\0') {
        if (this->usePeriodicBoundaryConditions_ == false) {
          Thermo::getBoundingBox(&local_518,this->thermo);
        }
        (*this->fDecomp_->_vptr_ForceDecomposition[0x11])
                  (this->fDecomp_,local_318,local_438,local_3d0);
      }
    }
    if (1 < (int)((ulong)((long)(this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                         (long)(this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
      lVar28 = 0;
      do {
        local_478 = lVar28;
        iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x13])();
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_4b8,(vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var_00,iVar16))
        ;
        piVar22 = (local_438->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar28 = (long)piVar22[local_478];
        local_3c0 = local_478 + 1;
        if (piVar22[local_478] < piVar22[local_478 + 1]) {
          uVar26 = CONCAT71((int7)((ulong)pSVar25 >> 8),1);
          do {
            uVar5 = (this->neighborList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar28];
            local_2f8 = lVar28;
            (*this->fDecomp_->_vptr_ForceDecomposition[0x19])(&local_518,this->fDecomp_,local_478);
            local_3e8[2] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][2];
            local_3e8[0] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][0];
            local_3e8[1] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][1];
            local_3a0[0] = 0.0;
            lVar28 = 0;
            do {
              local_3a0[0] = local_3a0[0] + local_3e8[lVar28] * local_3e8[lVar28];
              lVar28 = lVar28 + 1;
            } while (lVar28 != 3);
            if (local_3a0[0] < this->rCutSq_) {
              if (uVar15 == 1) {
                local_3a0[1] = 0.0;
                local_3a0[2] = 0.0;
                local_3a0[3] = 0.0;
                local_308[1].super_Vector<double,_3U>.data_[1] = 0.0;
                local_308[1].super_Vector<double,_3U>.data_[2] = 0.0;
                (local_308->super_Vector<double,_3U>).data_[2] = 0.0;
                local_308[1].super_Vector<double,_3U>.data_[0] = 0.0;
                (local_308->super_Vector<double,_3U>).data_[0] = 0.0;
                (local_308->super_Vector<double,_3U>).data_[1] = 0.0;
                *local_310 = 0.0;
                local_310[1] = 0.0;
                local_440 = 0.0;
              }
              bVar14 = SwitchingFunction::getSwitch
                                 (this->switcher_,local_3a0,local_300,&local_2b8,&local_2b0);
              uVar31 = CONCAT71(extraout_var,bVar14) & 0xffffffff;
              iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x14])
                                 (this->fDecomp_,(ulong)uVar5);
              std::vector<int,_std::allocator<int>_>::operator=
                        (&local_498,
                         (vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var_01,iVar16));
              if (this->doHeatFlux_ == true) {
                iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x12])
                                   (this->fDecomp_,(ulong)uVar5);
                pdVar18 = (double *)CONCAT44(extraout_var_02,iVar16);
                local_328 = pdVar18[2];
                local_338 = *pdVar18;
                dStack_330 = pdVar18[1];
              }
              cVar30 = (char)uVar31;
              puVar27 = (uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
              if (local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                uVar26 = uVar26 & 0xffffffff;
              }
              else {
                do {
                  uVar19 = (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  local_450 = puVar27;
                  local_4c8 = (double)CONCAT44(local_4c8._4_4_,*puVar27);
                  if (this->doPotentialSelection_ == true) {
                    iVar17 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1f])
                                       (this->fDecomp_,*puVar27);
                    iVar16 = iVar17 + 0x3f;
                    if (-1 < iVar17) {
                      iVar16 = iVar17;
                    }
                    (this->idat).isSelected =
                         (*(ulong *)((long)(iVar16 >> 6) * 8 +
                                     *(long *)&(((this->seleMan_).ss_.bitsets_.
                                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_
                                               ).super__Bvector_base<std::allocator<bool>_> + -8 +
                                    (ulong)(((long)iVar17 & 0x800000000000003fU) <
                                           0x8000000000000001) * 8) >> ((long)iVar17 & 0x3fU) & 1)
                         != 0;
                  }
                  uVar26 = CONCAT71((int7)(uVar31 >> 8),4 < uVar19 | (byte)uVar26);
                  for (puVar27 = (uint *)local_498.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start;
                      puVar27 !=
                      (uint *)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish; puVar27 = puVar27 + 1) {
                    uVar6 = *puVar27;
                    if (this->doPotentialSelection_ == true) {
                      iVar17 = (*this->fDecomp_->_vptr_ForceDecomposition[0x20])
                                         (this->fDecomp_,(ulong)uVar6);
                      iVar16 = iVar17 + 0x3f;
                      if (-1 < iVar17) {
                        iVar16 = iVar17;
                      }
                      pbVar2 = &(this->idat).isSelected;
                      *pbVar2 = (bool)(*pbVar2 |
                                      (*(ulong *)((long)(iVar16 >> 6) * 8 +
                                                  *(long *)&(((this->seleMan_).ss_.bitsets_.
                                                                                                                            
                                                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  bitset_).
                                                  super__Bvector_base<std::allocator<bool>_> + -8 +
                                                 (ulong)(((long)iVar17 & 0x800000000000003fU) <
                                                        0x8000000000000001) * 8) >>
                                       ((long)iVar17 & 0x3fU) & 1) != 0);
                    }
                    iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1d])
                                       (this->fDecomp_,(ulong)local_4c8 & 0xffffffff,(ulong)uVar6,
                                        local_478,(ulong)uVar5);
                    if ((char)iVar16 == '\0') {
                      (this->idat).vpair = 0.0;
                      local_2d8->data_[6] = 0.0;
                      local_2d8->data_[4] = 0.0;
                      local_2d8->data_[5] = 0.0;
                      local_2d8->data_[2] = 0.0;
                      local_2d8->data_[3] = 0.0;
                      local_2d8->data_[0] = 0.0;
                      local_2d8->data_[1] = 0.0;
                      local_2e0->data_[6] = 0.0;
                      local_2e0->data_[4] = 0.0;
                      local_2e0->data_[5] = 0.0;
                      local_2e0->data_[2] = 0.0;
                      local_2e0->data_[3] = 0.0;
                      local_2e0->data_[0] = 0.0;
                      local_2e0->data_[1] = 0.0;
                      local_2e8->data_[6] = 0.0;
                      local_2e8->data_[4] = 0.0;
                      local_2e8->data_[5] = 0.0;
                      local_2e8->data_[2] = 0.0;
                      local_2e8->data_[3] = 0.0;
                      local_2e8->data_[0] = 0.0;
                      local_2e8->data_[1] = 0.0;
                      (this->idat).f1.super_Vector<double,_3U>.data_[2] = 0.0;
                      (pVVar1->super_Vector<double,_3U>).data_[0] = 0.0;
                      (this->idat).f1.super_Vector<double,_3U>.data_[1] = 0.0;
                      *local_2f0 = 0.0;
                      local_2f0[1] = 0.0;
                      (*this->fDecomp_->_vptr_ForceDecomposition[0x26])
                                (this->fDecomp_,local_470,(ulong)local_4c8 & 0xffffffff,(ulong)uVar6
                                 ,(ulong)((uint)uVar26 & 1));
                      iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x22])
                                         (this->fDecomp_,(ulong)local_4c8 & 0xffffffff,(ulong)uVar6)
                      ;
                      (this->idat).topoDist = iVar16;
                      pdVar11 = (this->electrostaticScale_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      (this->idat).vdwMult =
                           (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[iVar16];
                      (this->idat).electroMult = pdVar11[iVar16];
                      if (((long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start == 4) &&
                         ((long)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start == 4)) {
                        (this->idat).d.super_Vector<double,_3U>.data_[2] = local_3e8[2];
                        (pos->super_Vector<double,_3U>).data_[0] = local_3e8[0];
                        (this->idat).d.super_Vector<double,_3U>.data_[1] = local_3e8[1];
                        (this->idat).r2 = local_3a0[0];
                        dVar12 = local_3a0[0];
                        if (this->doHeatFlux_ == true) {
                          local_428[2] = local_328;
                          local_428[0] = local_338;
                          local_428[1] = dStack_330;
                        }
                      }
                      else {
                        (*this->fDecomp_->_vptr_ForceDecomposition[0x1a])
                                  (&local_518,this->fDecomp_,(ulong)local_4c8 & 0xffffffff,
                                   (ulong)uVar6);
                        if ((Mat3x3d *)pos != &local_518) {
                          (this->idat).d.super_Vector<double,_3U>.data_[2] =
                               local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][2];
                          (pos->super_Vector<double,_3U>).data_[0] =
                               local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0];
                          (this->idat).d.super_Vector<double,_3U>.data_[1] =
                               local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1];
                        }
                        Snapshot::wrapVector(local_3b8,pos);
                        dVar12 = 0.0;
                        lVar28 = 0;
                        do {
                          dVar3 = (pos->super_Vector<double,_3U>).data_[lVar28];
                          dVar12 = dVar12 + dVar3 * dVar3;
                          lVar28 = lVar28 + 1;
                        } while (lVar28 != 3);
                        (this->idat).r2 = dVar12;
                        if (this->doHeatFlux_ == true) {
                          iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x25])
                                             (this->fDecomp_,(ulong)uVar6);
                          pdVar18 = (double *)CONCAT44(extraout_var_03,iVar16);
                          local_428[2] = pdVar18[2];
                          local_428[0] = *pdVar18;
                          local_428[1] = pdVar18[1];
                          dVar12 = (this->idat).r2;
                        }
                      }
                      if (dVar12 < 0.0) {
                        dVar12 = sqrt(dVar12);
                      }
                      else {
                        dVar12 = SQRT(dVar12);
                      }
                      (this->idat).rij = dVar12;
                      if (uVar15 == 0) {
                        InteractionManager::doPrePair(this->interactionMan_,local_470);
                        (*this->fDecomp_->_vptr_ForceDecomposition[0x27])
                                  (this->fDecomp_,local_470,(ulong)local_4c8 & 0xffffffff,
                                   (ulong)uVar6);
                      }
                      else {
                        InteractionManager::doPair(this->interactionMan_,local_470);
                        (*this->fDecomp_->_vptr_ForceDecomposition[0x28])
                                  (this->fDecomp_,local_470,(ulong)local_4c8 & 0xffffffff);
                        dVar12 = (this->idat).vpair;
                        lVar28 = 0;
                        do {
                          local_3a0[lVar28 + 1] =
                               (pVVar1->super_Vector<double,_3U>).data_[lVar28] +
                               local_3a0[lVar28 + 1];
                          lVar28 = lVar28 + 1;
                        } while (lVar28 != 3);
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[2][0] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[2][1] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[1][1] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[1][2] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][2] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[1][0] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][0] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][1] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[2][2] = 0.0;
                        padVar20 = (double (*) [3])&local_518;
                        lVar28 = 0;
                        do {
                          dVar3 = (pos->super_Vector<double,_3U>).data_[lVar28];
                          lVar24 = 0;
                          do {
                            (((SquareMatrix<double,_3> *)*padVar20)->
                            super_RectMatrix<double,_3U,_3U>).data_[0][lVar24] =
                                 (pVVar1->super_Vector<double,_3U>).data_[lVar24] * dVar3;
                            lVar24 = lVar24 + 1;
                          } while (lVar24 != 3);
                          lVar28 = lVar28 + 1;
                          padVar20 = padVar20 + 1;
                        } while (lVar28 != 3);
                        padVar20 = (double (*) [3])&local_518;
                        lVar28 = 0;
                        pMVar23 = local_448;
                        do {
                          lVar24 = 0;
                          do {
                            (pMVar23->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][lVar24] =
                                 (pMVar23->super_SquareMatrix<double,_3>).
                                 super_RectMatrix<double,_3U,_3U>.data_[0][lVar24] -
                                 (((SquareMatrix<double,_3> *)*padVar20)->
                                 super_RectMatrix<double,_3U,_3U>).data_[0][lVar24];
                            lVar24 = lVar24 + 1;
                          } while (lVar24 != 3);
                          lVar28 = lVar28 + 1;
                          pMVar23 = (Mat3x3d *)
                                    ((pMVar23->super_SquareMatrix<double,_3>).
                                     super_RectMatrix<double,_3U,_3U>.data_ + 1);
                          padVar20 = padVar20 + 1;
                        } while (lVar28 != 3);
                        local_440 = local_440 + dVar12;
                        if (this->doHeatFlux_ == true) {
                          pFVar10 = this->fDecomp_;
                          dVar12 = 0.0;
                          lVar28 = 0;
                          do {
                            dVar12 = dVar12 + (pVVar1->super_Vector<double,_3U>).data_[lVar28] *
                                              local_428[lVar28];
                            lVar28 = lVar28 + 1;
                          } while (lVar28 != 3);
                          local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][0] = 0.0;
                          local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][1] = 0.0;
                          local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] = 0.0;
                          lVar28 = 0;
                          do {
                            local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[0][lVar28] =
                                 (pos->super_Vector<double,_3U>).data_[lVar28] * dVar12;
                            lVar28 = lVar28 + 1;
                          } while (lVar28 != 3);
                          local_138 = local_518.super_SquareMatrix<double,_3>.
                                      super_RectMatrix<double,_3U,_3U>.data_[0][2];
                          local_148 = local_518.super_SquareMatrix<double,_3>.
                                      super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                          uStack_144 = local_518.super_SquareMatrix<double,_3>.
                                       super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                          uStack_140 = local_518.super_SquareMatrix<double,_3>.
                                       super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                          uStack_13c = local_518.super_SquareMatrix<double,_3>.
                                       super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                          (*pFVar10->_vptr_ForceDecomposition[0x2d])(pFVar10,&local_148);
                        }
                      }
                      uVar26 = 0;
                    }
                  }
                  puVar27 = local_450 + 1;
                  uVar31 = uVar26;
                } while (puVar27 !=
                         (uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish);
              }
              if (cVar30 == '\x01' && uVar15 == 1) {
                local_4c8 = (local_2b8 * local_440) / local_2b0;
                local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
                     = 0.0;
                local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
                     = 0.0;
                local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
                     = 0.0;
                lVar28 = 0;
                padVar20 = (double (*) [3])&local_518;
                do {
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [lVar28] = local_3e8[lVar28] * local_4c8;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 3);
                local_468[2] = local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][2];
                local_468[0] = local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0];
                local_468[1] = local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1];
                lVar28 = 0;
                do {
                  local_3a0[lVar28 + 1] = local_468[lVar28] + local_3a0[lVar28 + 1];
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 3);
                uStack_4c0 = 0;
                if ((((long)puVar27 -
                      (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start == 4) &&
                    ((long)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start == 4)) &&
                   (iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1d])
                                       (this->fDecomp_,
                                        (ulong)(uint)*local_4b8.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start,
                                        (ulong)(uint)*local_498.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start,
                                        local_478,(ulong)uVar5), (char)iVar16 == '\0')) {
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [0] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [1] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [1] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [2] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [0] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [1] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [2] = 0.0;
                  lVar28 = 0;
                  padVar21 = padVar20;
                  do {
                    dVar12 = (pos->super_Vector<double,_3U>).data_[lVar28];
                    lVar24 = 0;
                    do {
                      (((SquareMatrix<double,_3> *)*padVar21)->super_RectMatrix<double,_3U,_3U>).
                      data_[0][lVar24] = local_468[lVar24] * dVar12;
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 3);
                    lVar28 = lVar28 + 1;
                    padVar21 = padVar21 + 1;
                  } while (lVar28 != 3);
                  lVar28 = 0;
                  pMVar23 = local_448;
                  do {
                    lVar24 = 0;
                    do {
                      (pMVar23->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                      data_[0][lVar24] =
                           (pMVar23->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
                           .data_[0][lVar24] - (*padVar20)[lVar24];
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 3);
                    lVar28 = lVar28 + 1;
                    pMVar23 = (Mat3x3d *)
                              ((pMVar23->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_ + 1);
                    padVar20 = padVar20 + 1;
                  } while (lVar28 != 3);
                  if (this->doHeatFlux_ == true) {
                    pFVar10 = this->fDecomp_;
                    dVar12 = 0.0;
                    lVar28 = 0;
                    do {
                      dVar12 = dVar12 + local_468[lVar28] * local_428[lVar28];
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 3);
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][0] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][1] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][2] = 0.0;
                    lVar28 = 0;
                    do {
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][lVar28] = (pos->super_Vector<double,_3U>).data_[lVar28] * dVar12;
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 3);
                    local_158 = local_518.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][2];
                    local_168 = local_518.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                    uStack_164 = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                    uStack_160 = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                    uStack_15c = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                    (*pFVar10->_vptr_ForceDecomposition[0x2d])(pFVar10,&local_168);
                  }
                }
                local_450 = (uint *)CONCAT44(local_450._4_4_,(int)uVar26);
                for (puVar27 = (uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                    puVar27 !=
                    (uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish; puVar27 = puVar27 + 1) {
                  uVar5 = *puVar27;
                  iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x17])
                                     (this->fDecomp_,(ulong)uVar5);
                  dVar12 = *(double *)CONCAT44(extraout_var_04,iVar16);
                  local_2a8[0] = 0.0;
                  local_2a8[1] = 0.0;
                  local_2a8[2] = 0.0;
                  lVar28 = 0;
                  do {
                    local_2a8[lVar28] = local_3e8[lVar28] * local_4c8;
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 3);
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [1] = 0.0;
                  local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2] = 0.0;
                  lVar28 = 0;
                  do {
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][lVar28] = local_2a8[lVar28] * dVar12;
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 3);
                  local_468[2] = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][2];
                  local_468[0] = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][0];
                  local_468[1] = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1];
                  local_178 = local_518.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][2];
                  local_188 = local_518.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                  uStack_184 = local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                  uStack_180 = local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                  uStack_17c = local_518.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                  (*this->fDecomp_->_vptr_ForceDecomposition[0x23])
                            (this->fDecomp_,(ulong)uVar5,&local_188);
                  if ((4 < (ulong)((long)local_4b8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start)) &&
                     (this->info_->usesAtomicVirial_ == true)) {
                    padVar20 = (double (*) [3])&local_518;
                    (*this->fDecomp_->_vptr_ForceDecomposition[0x15])
                              (padVar20,this->fDecomp_,(ulong)uVar5);
                    local_408[2] = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][2];
                    local_408[0] = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0];
                    local_408[1] = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1];
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [2][0] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [2][1] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [1][1] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [1][2] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][2] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [1][0] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][0] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][1] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [2][2] = 0.0;
                    lVar28 = 0;
                    padVar21 = padVar20;
                    do {
                      dVar12 = local_408[lVar28];
                      lVar24 = 0;
                      do {
                        (((SquareMatrix<double,_3> *)*padVar21)->super_RectMatrix<double,_3U,_3U>).
                        data_[0][lVar24] = local_468[lVar24] * dVar12;
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 3);
                      lVar28 = lVar28 + 1;
                      padVar21 = padVar21 + 1;
                    } while (lVar28 != 3);
                    lVar28 = 0;
                    pMVar23 = local_448;
                    do {
                      lVar24 = 0;
                      do {
                        (pMVar23->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0][lVar24] =
                             (pMVar23->super_SquareMatrix<double,_3>).
                             super_RectMatrix<double,_3U,_3U>.data_[0][lVar24] - (*padVar20)[lVar24]
                        ;
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 3);
                      lVar28 = lVar28 + 1;
                      pMVar23 = (Mat3x3d *)
                                ((pMVar23->super_SquareMatrix<double,_3>).
                                 super_RectMatrix<double,_3U,_3U>.data_ + 1);
                      padVar20 = padVar20 + 1;
                    } while (lVar28 != 3);
                    if (this->doHeatFlux_ == true) {
                      pFVar10 = this->fDecomp_;
                      dVar12 = 0.0;
                      lVar28 = 0;
                      do {
                        dVar12 = dVar12 + local_468[lVar28] * local_428[lVar28];
                        lVar28 = lVar28 + 1;
                      } while (lVar28 != 3);
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][0] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][1] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][2] = 0.0;
                      lVar28 = 0;
                      do {
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][lVar28] = local_408[lVar28] * dVar12;
                        lVar28 = lVar28 + 1;
                      } while (lVar28 != 3);
                      local_198 = local_518.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][2];
                      local_1a8 = local_518.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                      uStack_1a4 = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                      uStack_1a0 = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                      uStack_19c = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                      (*pFVar10->_vptr_ForceDecomposition[0x2d])(pFVar10,&local_1a8);
                    }
                  }
                }
                if (local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_4c8 = -local_4c8;
                  uStack_4c0 = uStack_4c0 ^ 0x8000000000000000;
                  puVar27 = (uint *)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                  do {
                    uVar5 = *puVar27;
                    iVar16 = (*this->fDecomp_->_vptr_ForceDecomposition[0x18])
                                       (this->fDecomp_,(ulong)uVar5);
                    dVar12 = *(double *)CONCAT44(extraout_var_05,iVar16);
                    local_2a8[0] = 0.0;
                    local_2a8[1] = 0.0;
                    local_2a8[2] = 0.0;
                    lVar28 = 0;
                    do {
                      local_2a8[lVar28] = local_3e8[lVar28] * local_4c8;
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 3);
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][0] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][1] = 0.0;
                    local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][2] = 0.0;
                    lVar28 = 0;
                    do {
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][lVar28] = local_2a8[lVar28] * dVar12;
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 3);
                    local_468[2] = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][2];
                    local_468[0] = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0];
                    local_468[1] = local_518.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1];
                    local_1b8 = local_518.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][2];
                    local_1c8 = local_518.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                    uStack_1c4 = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                    uStack_1c0 = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                    uStack_1bc = local_518.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                    (*this->fDecomp_->_vptr_ForceDecomposition[0x24])
                              (this->fDecomp_,(ulong)uVar5,&local_1c8);
                    if ((4 < (ulong)((long)local_498.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_498.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start)) &&
                       (this->info_->usesAtomicVirial_ == true)) {
                      padVar20 = (double (*) [3])&local_518;
                      (*this->fDecomp_->_vptr_ForceDecomposition[0x16])
                                (padVar20,this->fDecomp_,(ulong)uVar5);
                      local_408[2] = local_518.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][2];
                      local_408[0] = local_518.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][0];
                      local_408[1] = local_518.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1];
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][0] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][1] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][1] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][2] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][2] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][0] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][0] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][1] = 0.0;
                      local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][2] = 0.0;
                      lVar28 = 0;
                      padVar21 = padVar20;
                      do {
                        dVar12 = local_408[lVar28];
                        lVar24 = 0;
                        do {
                          (((SquareMatrix<double,_3> *)*padVar21)->super_RectMatrix<double,_3U,_3U>)
                          .data_[0][lVar24] = local_468[lVar24] * dVar12;
                          lVar24 = lVar24 + 1;
                        } while (lVar24 != 3);
                        lVar28 = lVar28 + 1;
                        padVar21 = padVar21 + 1;
                      } while (lVar28 != 3);
                      lVar28 = 0;
                      pMVar23 = local_448;
                      do {
                        lVar24 = 0;
                        do {
                          (pMVar23->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar24] =
                               (pMVar23->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[0][lVar24] -
                               (*padVar20)[lVar24];
                          lVar24 = lVar24 + 1;
                        } while (lVar24 != 3);
                        lVar28 = lVar28 + 1;
                        pMVar23 = (Mat3x3d *)
                                  ((pMVar23->super_SquareMatrix<double,_3>).
                                   super_RectMatrix<double,_3U,_3U>.data_ + 1);
                        padVar20 = padVar20 + 1;
                      } while (lVar28 != 3);
                      if (this->doHeatFlux_ == true) {
                        pFVar10 = this->fDecomp_;
                        dVar12 = 0.0;
                        lVar28 = 0;
                        do {
                          dVar12 = dVar12 + local_468[lVar28] * local_428[lVar28];
                          lVar28 = lVar28 + 1;
                        } while (lVar28 != 3);
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][0] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][1] = 0.0;
                        local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][2] = 0.0;
                        lVar28 = 0;
                        do {
                          local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar28] = local_408[lVar28] * dVar12;
                          lVar28 = lVar28 + 1;
                        } while (lVar28 != 3);
                        local_1d8 = local_518.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][2];
                        local_1e8 = local_518.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                        uStack_1e4 = local_518.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                        uStack_1e0 = local_518.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                        uStack_1dc = local_518.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                        (*pFVar10->_vptr_ForceDecomposition[0x2d])(pFVar10,&local_1e8);
                      }
                    }
                    puVar27 = puVar27 + 1;
                  } while (puVar27 !=
                           (uint *)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
                }
                uVar26 = (ulong)local_450 & 0xffffffff;
              }
            }
            lVar28 = local_2f8 + 1;
            piVar22 = (local_438->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          } while (lVar28 < piVar22[local_3c0]);
        }
        pSVar25 = local_3c8;
        lVar28 = local_3c0;
      } while (local_3c0 <
               ((long)(this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar22) * 0x40000000 + -0x100000000
               >> 0x20);
    }
    if (uVar15 != 0) break;
    if (this->info_->requiresPrepair_ == true) {
      (*this->fDecomp_->_vptr_ForceDecomposition[6])();
      if (this->info_->nAtoms_ != 0) {
        uVar26 = 0;
        do {
          if (this->doPotentialSelection_ == true) {
            iVar17 = (*this->fDecomp_->_vptr_ForceDecomposition[0x21])(this->fDecomp_,uVar26);
            iVar16 = iVar17 + 0x3f;
            if (-1 < iVar17) {
              iVar16 = iVar17;
            }
            (this->sdat).isSelected =
                 (*(ulong *)((long)(iVar16 >> 6) * 8 +
                             *(long *)&(((this->seleMan_).ss_.bitsets_.
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                       super__Bvector_base<std::allocator<bool>_> + -8 +
                            (ulong)(((long)iVar17 & 0x800000000000003fU) < 0x8000000000000001) * 8)
                  >> ((long)iVar17 & 0x3fU) & 1) != 0;
          }
          (*this->fDecomp_->_vptr_ForceDecomposition[0x2b])(this->fDecomp_,pSVar25,uVar26);
          InteractionManager::doPreForce(this->interactionMan_,pSVar25);
          (*this->fDecomp_->_vptr_ForceDecomposition[0x2c])(this->fDecomp_,pSVar25,uVar26);
          uVar15 = (int)uVar26 + 1;
          uVar26 = (ulong)uVar15;
        } while (uVar15 < (uint)this->info_->nAtoms_);
      }
      (*this->fDecomp_->_vptr_ForceDecomposition[7])();
    }
    uVar15 = 1;
  }
  (*this->fDecomp_->_vptr_ForceDecomposition[8])();
  pSVar8 = local_3b8;
  if (this->cutoffMethod_ == EWALD_FULL) {
    InteractionManager::doReciprocalSpaceSum(this->interactionMan_,&local_3a8);
    Snapshot::setReciprocalPotential(pSVar8,local_3a8);
  }
  if (this->useSurfaceTerm_ == true) {
    InteractionManager::doSurfaceTerm
              (this->interactionMan_,this->useSlabGeometry_,this->axis_,&local_3b0);
    Snapshot::setSurfacePotential(pSVar8,local_3b0);
  }
  pSVar25 = local_3c8;
  if ((this->info_->requiresSelfCorrection_ == true) && (this->info_->nAtoms_ != 0)) {
    uVar26 = 0;
    do {
      if (this->doPotentialSelection_ == true) {
        iVar17 = (*this->fDecomp_->_vptr_ForceDecomposition[0x21])(this->fDecomp_,uVar26);
        iVar16 = iVar17 + 0x3f;
        if (-1 < iVar17) {
          iVar16 = iVar17;
        }
        (this->sdat).isSelected =
             (*(ulong *)((long)(iVar16 >> 6) * 8 +
                         *(long *)&(((this->seleMan_).ss_.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                   super__Bvector_base<std::allocator<bool>_> + -8 +
                        (ulong)(((long)iVar17 & 0x800000000000003fU) < 0x8000000000000001) * 8) >>
              ((long)iVar17 & 0x3fU) & 1) != 0;
      }
      (*this->fDecomp_->_vptr_ForceDecomposition[0x29])(this->fDecomp_,pSVar25,uVar26);
      InteractionManager::doSelfCorrection(this->interactionMan_,pSVar25);
      (*this->fDecomp_->_vptr_ForceDecomposition[0x2a])(this->fDecomp_,pSVar25,uVar26);
      uVar15 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar15;
    } while (uVar15 < (uint)this->info_->nAtoms_);
  }
  (*this->fDecomp_->_vptr_ForceDecomposition[9])();
  (*this->fDecomp_->_vptr_ForceDecomposition[0xb])(&local_518);
  local_1f8 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0];
  local_208 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  dStack_200 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
  local_218 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  dStack_210 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0];
  local_228 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dStack_220 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  local_68.data_[0] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  local_68.data_[1] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  local_68.data_[2] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  local_68.data_[3] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0];
  local_68.data_[4] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  local_68.data_[5] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
  local_68.data_[6] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0];
  Snapshot::setLongRangePotentials(pSVar8,&local_68);
  (*this->fDecomp_->_vptr_ForceDecomposition[10])(&local_518);
  local_238 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0];
  local_248 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  dStack_240 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
  local_258 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  dStack_250 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0];
  local_268 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dStack_260 = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  local_a8.data_[0] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  local_a8.data_[1] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  local_a8.data_[2] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  local_a8.data_[3] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0];
  local_a8.data_[4] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  local_a8.data_[5] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
  local_a8.data_[6] =
       local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0];
  Snapshot::setSelfPotentials(pSVar8,&local_a8);
  (*this->fDecomp_->_vptr_ForceDecomposition[0xe])(&local_518);
  (*this->fDecomp_->_vptr_ForceDecomposition[0xc])(local_2a8);
  local_128.data_[4] = 0.0;
  local_128.data_[5] = 0.0;
  local_128.data_[2] = 0.0;
  local_128.data_[3] = 0.0;
  local_128.data_[0] = 0.0;
  local_128.data_[1] = 0.0;
  local_128.data_[6] = 0.0;
  lVar28 = 0;
  do {
    local_128.data_[lVar28] =
         local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar28] +
         local_2a8[lVar28];
    lVar28 = lVar28 + 1;
  } while (lVar28 != 7);
  Snapshot::setExcludedPotentials(pSVar8,&local_128);
  if (this->doPotentialSelection_ == true) {
    Snapshot::getSelectionPotentials((potVec *)&local_518,pSVar8);
    local_378[6] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                   [0];
    local_378[4] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [1];
    local_378[5] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [2];
    local_378[2] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   [2];
    local_378[3] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [0];
    local_378[0] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   [0];
    local_378[1] = local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   [1];
    (*this->fDecomp_->_vptr_ForceDecomposition[0xf])();
    lVar28 = 0;
    do {
      local_378[lVar28] =
           local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar28]
           + local_378[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 7);
    (*this->fDecomp_->_vptr_ForceDecomposition[0xd])(&local_518);
    lVar28 = 0;
    do {
      local_378[lVar28] =
           local_518.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar28]
           + local_378[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 7);
    local_e8.data_[0] = local_378[0];
    local_e8.data_[1] = local_378[1];
    local_e8.data_[2] = local_378[2];
    local_e8.data_[3] = local_378[3];
    local_e8.data_[4] = local_378[4];
    local_e8.data_[5] = local_378[5];
    local_e8.data_[6] = local_378[6];
    Snapshot::setSelectionPotentials(pSVar8,&local_e8);
  }
  if ((uint *)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((uint *)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ForceManager::selectedLongRangeInteractions(Molecule* mol1,
                                                   Molecule* mol2) {
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    DataStorage* config   = &(curSnapshot->atomData);
    DataStorage* cgConfig = &(curSnapshot->cgData);

    // calculate the center of mass of cutoff group

    SimInfo::MoleculeIterator mi;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    if (info_->getNCutoffGroups() != info_->getNAtoms()) {
      for (cg = mol1->beginCutoffGroup(ci); cg != NULL;
           cg = mol1->nextCutoffGroup(ci)) {
        cg->updateCOM();
      }
      for (cg = mol2->beginCutoffGroup(ci); cg != NULL;
           cg = mol2->nextCutoffGroup(ci)) {
        cg->updateCOM();
      }
    } else {
      // center of mass of the group is the same as position of the atom
      // if cutoff group does not exist
      cgConfig->position = config->position;
      cgConfig->velocity = config->velocity;
    }

    fDecomp_->zeroWorkArrays();
    fDecomp_->distributeData();

    int cg1, cg2, atom1, atom2;
    Vector3d d_grp, dag, gvel2, vel2;
    RealType rgrpsq, rgrp;
    RealType vij(0.0);
    Vector3d fij, fg;
    bool in_switching_region;
    RealType dswdr, swderiv;
    vector<int> atomListColumn, atomListRow;

    potVec longRangePotential(0.0);
    potVec selfPotential(0.0);
    potVec selectionPotential(0.0);
    RealType reciprocalPotential(0.0);
    RealType surfacePotential(0.0);

    RealType mf;
    bool newAtom1;
    int gid1, gid2;

    vector<int>::iterator ia, jb;

    int loopStart, loopEnd;

    idat.rcut       = rCut_;
    idat.shiftedPot = (cutoffMethod_ == SHIFTED_POTENTIAL) ? true : false;
    idat.shiftedForce =
        (cutoffMethod_ == SHIFTED_FORCE || cutoffMethod_ == TAYLOR_SHIFTED) ?
            true :
            false;
    idat.doParticlePot   = doParticlePot_;
    idat.doElectricField = doElectricField_;
    idat.doSitePotential = doSitePotential_;
    sdat.doParticlePot   = doParticlePot_;

    loopEnd = PAIR_LOOP;
    if (info_->requiresPrepair()) {
      loopStart = PREPAIR_LOOP;
    } else {
      loopStart = PAIR_LOOP;
    }
    for (int iLoop = loopStart; iLoop <= loopEnd; iLoop++) {
      if (iLoop == loopStart) {
        bool update_nlist = fDecomp_->checkNeighborList(savedPositions_);

        if (update_nlist) {
          if (!usePeriodicBoundaryConditions_)
            Mat3x3d bbox = thermo->getBoundingBox();
          fDecomp_->buildNeighborList(neighborList_, point_, savedPositions_);
        }
      }

      for (cg1 = 0; cg1 < int(point_.size()) - 1; cg1++) {
        atomListRow = fDecomp_->getAtomsInGroupRow(cg1);
        newAtom1    = true;

        for (int m2 = point_[cg1]; m2 < point_[cg1 + 1]; m2++) {
          cg2 = neighborList_[m2];

          d_grp = fDecomp_->getIntergroupVector(cg1, cg2);

          // already wrapped in the getIntergroupVector call:
          // curSnapshot->wrapVector(d_grp);
          rgrpsq = d_grp.lengthSquare();

          if (rgrpsq < rCutSq_) {
            if (iLoop == PAIR_LOOP) {
              vij = 0.0;
              fij.zero();
              idat.eField1.zero();
              idat.eField2.zero();
              idat.sPot1 = 0.0;
              idat.sPot2 = 0.0;
            }

            in_switching_region =
                switcher_->getSwitch(rgrpsq, idat.sw, dswdr, rgrp);

            atomListColumn = fDecomp_->getAtomsInGroupColumn(cg2);

            if (doHeatFlux_) gvel2 = fDecomp_->getGroupVelocityColumn(cg2);

            for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
              if (atomListRow.size() > 1) newAtom1 = true;
              atom1 = (*ia);

              if (doPotentialSelection_) {
                gid1            = fDecomp_->getGlobalIDRow(atom1);
                idat.isSelected = seleMan_.isGlobalIDSelected(gid1);
              }

              for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                   ++jb) {
                atom2 = (*jb);

                if (doPotentialSelection_) {
                  gid2 = fDecomp_->getGlobalIDCol(atom2);
                  idat.isSelected |= seleMan_.isGlobalIDSelected(gid2);
                }

                if (!fDecomp_->skipAtomPair(atom1, atom2, cg1, cg2)) {
                  idat.vpair       = 0.0;
                  idat.pot         = 0.0;
                  idat.excludedPot = 0.0;
                  idat.selePot     = 0.0;
                  idat.f1.zero();
                  idat.dVdFQ1 = 0.0;
                  idat.dVdFQ2 = 0.0;

                  fDecomp_->fillInteractionData(idat, atom1, atom2, newAtom1);
                  newAtom1 = false;

                  idat.topoDist =
                      fDecomp_->getTopologicalDistance(atom1, atom2);
                  idat.vdwMult     = vdwScale_[idat.topoDist];
                  idat.electroMult = electrostaticScale_[idat.topoDist];

                  if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                    idat.d  = d_grp;
                    idat.r2 = rgrpsq;
                    if (doHeatFlux_) vel2 = gvel2;
                  } else {
                    idat.d = fDecomp_->getInteratomicVector(atom1, atom2);
                    curSnapshot->wrapVector(idat.d);
                    idat.r2 = idat.d.lengthSquare();
                    if (doHeatFlux_)
                      vel2 = fDecomp_->getAtomVelocityColumn(atom2);
                  }

                  idat.rij = sqrt(idat.r2);

                  if (iLoop == PREPAIR_LOOP) {
                    interactionMan_->doPrePair(idat);
                    fDecomp_->unpackPrePairData(idat, atom1, atom2);
                  } else {
                    interactionMan_->doPair(idat);
                    fDecomp_->unpackInteractionData(idat, atom1, atom2);
                    vij += idat.vpair;
                    fij += idat.f1;
                    virialTensor -= outProduct(idat.d, idat.f1);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(idat.f1, vel2));
                  }
                }
              }
            }

            if (iLoop == PAIR_LOOP) {
              if (in_switching_region) {
                swderiv = vij * dswdr / rgrp;
                fg      = swderiv * d_grp;
                fij += fg;

                if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                  if (!fDecomp_->skipAtomPair(atomListRow[0], atomListColumn[0],
                                              cg1, cg2)) {
                    virialTensor -= outProduct(idat.d, fg);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(fg, vel2));
                  }
                }

                for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
                  atom1 = (*ia);
                  mf    = fDecomp_->getMassFactorRow(atom1);
                  // fg is the force on atom ia due to cutoff group's
                  // presence in switching region
                  fg = swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomRow(atom1, fg);
                  if (atomListRow.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorRow(atom1, cg1);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
                for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                     ++jb) {
                  atom2 = (*jb);
                  mf    = fDecomp_->getMassFactorColumn(atom2);
                  // fg is the force on atom jb due to cutoff group's
                  // presence in switching region
                  fg = -swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomColumn(atom2, fg);

                  if (atomListColumn.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorColumn(atom2, cg2);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
              }
              // if (!info_->usesAtomicVirial()) {
              //  virialTensor -= outProduct(d_grp, fij);
              //  if (doHeatFlux_)
              //     fDecomp_->addToHeatFlux( d_grp * dot(fij, vel2));
              //}
            }
          }
        }
      }

      if (iLoop == PREPAIR_LOOP) {
        if (info_->requiresPrepair()) {
          fDecomp_->collectIntermediateData();

          for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
            if (doPotentialSelection_) {
              gid1            = fDecomp_->getGlobalID(atom1);
              sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
            }

            fDecomp_->fillPreForceData(sdat, atom1);
            interactionMan_->doPreForce(sdat);
            fDecomp_->unpackPreForceData(sdat, atom1);
          }

          fDecomp_->distributeIntermediateData();
        }
      }
    }

    // collects pairwise information
    fDecomp_->collectData();
    if (cutoffMethod_ == EWALD_FULL) {
      interactionMan_->doReciprocalSpaceSum(reciprocalPotential);
      curSnapshot->setReciprocalPotential(reciprocalPotential);
    }

    if (useSurfaceTerm_) {
      interactionMan_->doSurfaceTerm(useSlabGeometry_, axis_, surfacePotential);
      curSnapshot->setSurfacePotential(surfacePotential);
    }

    if (info_->requiresSelfCorrection()) {
      for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
        if (doPotentialSelection_) {
          gid1            = fDecomp_->getGlobalID(atom1);
          sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
        }

        fDecomp_->fillSelfData(sdat, atom1);
        interactionMan_->doSelfCorrection(sdat);
        fDecomp_->unpackSelfData(sdat, atom1);
      }
    }

    // collects single-atom information
    fDecomp_->collectSelfData();

    longRangePotential = fDecomp_->getPairwisePotential();
    curSnapshot->setLongRangePotentials(longRangePotential);

    selfPotential = fDecomp_->getSelfPotential();
    curSnapshot->setSelfPotentials(selfPotential);

    curSnapshot->setExcludedPotentials(fDecomp_->getExcludedSelfPotential() +
                                       fDecomp_->getExcludedPotential());

    if (doPotentialSelection_) {
      selectionPotential = curSnapshot->getSelectionPotentials();
      selectionPotential += fDecomp_->getSelectedSelfPotential();
      selectionPotential += fDecomp_->getSelectedPotential();
      curSnapshot->setSelectionPotentials(selectionPotential);
    }
  }